

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O3

void Fxch_ManComputeLevel(Fxch_Man_t *pFxchMan)

{
  uint *puVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Wec_t *pVVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  pVVar7 = pFxchMan->vCubes;
  if (pVVar7->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  if (0 < pVVar7->pArray->nSize) {
    uVar5 = *pVVar7->pArray->pArray;
    iVar6 = pFxchMan->nVars;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    iVar4 = 0x10;
    if (0xe < iVar6 - 1U) {
      iVar4 = iVar6;
    }
    pVVar3->nCap = iVar4;
    iVar9 = 0;
    if (iVar4 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar4 << 2);
    }
    pVVar3->pArray = __s;
    pVVar3->nSize = iVar6;
    memset(__s,0,(long)iVar6 << 2);
    pFxchMan->vLevels = pVVar3;
    lVar8 = 0;
    lVar10 = 0;
    while (pVVar3 = pVVar7->pArray, 0 < *(int *)((long)&pVVar3->nSize + lVar8)) {
      puVar1 = *(uint **)((long)&pVVar3->pArray + lVar8);
      pVVar2 = pFxchMan->vLevels;
      if (uVar5 != *puVar1) {
        if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        iVar6 = pVVar2->pArray[uVar5] - iVar9;
        iVar9 = (int)lVar10;
        pVVar2->pArray[uVar5] = iVar6 + iVar9;
        if (*(int *)((long)&pVVar3->nSize + lVar8) < 1) break;
        uVar5 = *puVar1;
      }
      iVar6 = Fxch_ManComputeLevelCube(pFxchMan,(Vec_Int_t *)((long)&pVVar3->nCap + lVar8));
      if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) break;
      if (pVVar2->pArray[uVar5] < iVar6) {
        pVVar2->pArray[uVar5] = iVar6;
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pFxchMan->vCubes;
      lVar8 = lVar8 + 0x10;
      if (pVVar7->nSize <= lVar10) {
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Fxch_ManComputeLevel( Fxch_Man_t* pFxchMan )
{
    Vec_Int_t* vCube;
    int i,
        iVar,
        iFirst = 0;

    iVar = Vec_IntEntry( Vec_WecEntry( pFxchMan->vCubes, 0 ), 0 );
    pFxchMan->vLevels = Vec_IntStart( pFxchMan->nVars );

    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, i )
    {
        if ( iVar != Vec_IntEntry( vCube, 0 ) )
        {
            Vec_IntAddToEntry( pFxchMan->vLevels, iVar, i - iFirst );
            iVar = Vec_IntEntry( vCube, 0 );
            iFirst = i;
        }
        Vec_IntUpdateEntry( pFxchMan->vLevels, iVar, Fxch_ManComputeLevelCube( pFxchMan, vCube ) );
    }
}